

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ModuleRunnerBase<wasm::ModuleRunner>::visitMemoryInit
          (Flow *__return_storage_ptr__,ModuleRunnerBase<wasm::ModuleRunner> *this,MemoryInit *curr)

{
  Name memory;
  Type TVar1;
  undefined1 this_00 [8];
  bool bVar2;
  ExpressionRunner<wasm::ModuleRunner> *pEVar3;
  long lVar4;
  uint64_t uVar5;
  address64_t aVar6;
  address64_t aVar7;
  size_type sVar8;
  size_type sVar9;
  address64_t aVar10;
  ExternalInterface *pEVar11;
  reference pvVar12;
  Name NVar13;
  Literal local_1c8;
  address64_t local_1b0;
  undefined1 local_1a8 [8];
  Literal addr;
  size_t i;
  Address local_170;
  Address memorySize;
  undefined1 local_158 [8];
  MemoryInstanceInfo info;
  Address sizeVal;
  Address offsetVal;
  Address destVal;
  DataSegment *segment;
  Flow size;
  Flow offset;
  undefined1 local_68 [8];
  Flow dest;
  MemoryInit *curr_local;
  ModuleRunnerBase<wasm::ModuleRunner> *this_local;
  
  dest.breakTo.super_IString.str._M_str = (char *)curr;
  pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
  ExpressionRunner<wasm::ModuleRunner>::visit
            ((Flow *)local_68,pEVar3,*(Expression **)(dest.breakTo.super_IString.str._M_str + 0x20))
  ;
  bVar2 = Flow::breaking((Flow *)local_68);
  if (bVar2) {
    Flow::Flow(__return_storage_ptr__,(Flow *)local_68);
  }
  else {
    pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
    ExpressionRunner<wasm::ModuleRunner>::visit
              ((Flow *)&size.breakTo.super_IString.str._M_str,pEVar3,
               *(Expression **)(dest.breakTo.super_IString.str._M_str + 0x28));
    bVar2 = Flow::breaking((Flow *)&size.breakTo.super_IString.str._M_str);
    if (bVar2) {
      Flow::Flow(__return_storage_ptr__,(Flow *)&size.breakTo.super_IString.str._M_str);
    }
    else {
      pEVar3 = (ExpressionRunner<wasm::ModuleRunner> *)self(this);
      ExpressionRunner<wasm::ModuleRunner>::visit
                ((Flow *)&segment,pEVar3,
                 *(Expression **)(dest.breakTo.super_IString.str._M_str + 0x30));
      bVar2 = Flow::breaking((Flow *)&segment);
      if (bVar2) {
        Flow::Flow(__return_storage_ptr__,(Flow *)&segment);
      }
      else {
        NVar13.super_IString.str._M_str = *(char **)(dest.breakTo.super_IString.str._M_str + 0x10);
        NVar13.super_IString.str._M_len = (size_t)this->wasm;
        lVar4 = ::wasm::Module::getDataSegment(NVar13);
        Flow::getSingleValue((Flow *)local_68);
        uVar5 = ::wasm::Literal::getUnsigned();
        Address::Address(&offsetVal,uVar5);
        Flow::getSingleValue((Flow *)&size.breakTo.super_IString.str._M_str);
        uVar5 = ::wasm::Literal::getUnsigned();
        Address::Address(&sizeVal,uVar5);
        Flow::getSingleValue((Flow *)&segment);
        uVar5 = ::wasm::Literal::getUnsigned();
        Address::Address((Address *)&info.name.super_IString.str._M_str,uVar5);
        aVar6 = Address::operator_cast_to_unsigned_long(&sizeVal);
        aVar7 = Address::operator_cast_to_unsigned_long
                          ((Address *)&info.name.super_IString.str._M_str);
        if (aVar6 + aVar7 != 0) {
          sVar8 = std::
                  unordered_set<wasm::Name,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<wasm::Name>_>
                  ::count(&this->droppedDataSegments,
                          (key_type *)(dest.breakTo.super_IString.str._M_str + 0x10));
          if (sVar8 != 0) {
            (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                      (this,"out of bounds segment access in memory.init");
          }
        }
        aVar6 = Address::operator_cast_to_unsigned_long(&sizeVal);
        aVar7 = Address::operator_cast_to_unsigned_long
                          ((Address *)&info.name.super_IString.str._M_str);
        sVar9 = std::vector<char,_std::allocator<char>_>::size
                          ((vector<char,_std::allocator<char>_> *)(lVar4 + 0x38));
        if (sVar9 < aVar6 + aVar7) {
          (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                    (this,"out of bounds segment access in memory.init");
        }
        memorySize.addr = (((IString *)(dest.breakTo.super_IString.str._M_str + 0x38))->str)._M_len;
        getMemoryInstanceInfo
                  ((MemoryInstanceInfo *)local_158,this,
                   (Name)((IString *)(dest.breakTo.super_IString.str._M_str + 0x38))->str);
        memory.super_IString.str._M_len._4_4_ = info.instance._4_4_;
        memory.super_IString.str._M_len._0_4_ = info.instance._0_4_;
        memory.super_IString.str._M_str._4_4_ = info.name.super_IString.str._M_len._4_4_;
        memory.super_IString.str._M_str._0_4_ = (undefined4)info.name.super_IString.str._M_len;
        local_170 = getMemorySize((ModuleRunnerBase<wasm::ModuleRunner> *)local_158,memory);
        aVar6 = Address::operator_cast_to_unsigned_long(&offsetVal);
        aVar7 = Address::operator_cast_to_unsigned_long
                          ((Address *)&info.name.super_IString.str._M_str);
        aVar10 = Address::operator_cast_to_unsigned_long(&local_170);
        if (aVar10 << 0x10 < aVar6 + aVar7) {
          (*(this->super_ExpressionRunner<wasm::ModuleRunner>)._vptr_ExpressionRunner[2])
                    (this,"out of bounds memory access in memory.init");
        }
        addr.type.id = 0;
        while( true ) {
          TVar1.id = addr.type.id;
          aVar6 = Address::operator_cast_to_unsigned_long
                            ((Address *)&info.name.super_IString.str._M_str);
          if (aVar6 <= TVar1.id) break;
          aVar6 = Address::operator_cast_to_unsigned_long(&offsetVal);
          wasm::Literal::Literal((Literal *)local_1a8,aVar6 + addr.type.id);
          pEVar11 = MemoryInstanceInfo::interface((MemoryInstanceInfo *)local_158);
          this_00 = local_158;
          ::wasm::Literal::Literal(&local_1c8,(Literal *)local_1a8);
          local_1b0 = (address64_t)
                      getFinalAddressWithoutOffset
                                ((ModuleRunnerBase<wasm::ModuleRunner> *)this_00,&local_1c8,1,
                                 local_170);
          aVar6 = Address::operator_cast_to_unsigned_long(&sizeVal);
          pvVar12 = std::vector<char,_std::allocator<char>_>::operator[]
                              ((vector<char,_std::allocator<char>_> *)(lVar4 + 0x38),
                               aVar6 + addr.type.id);
          (*pEVar11->_vptr_ExternalInterface[0x16])
                    (pEVar11,local_1b0,(ulong)(uint)(int)*pvVar12,
                     CONCAT44(info.instance._4_4_,info.instance._0_4_),
                     CONCAT44(info.name.super_IString.str._M_len._4_4_,
                              (undefined4)info.name.super_IString.str._M_len));
          ::wasm::Literal::~Literal(&local_1c8);
          ::wasm::Literal::~Literal((Literal *)local_1a8);
          addr.type.id = addr.type.id + 1;
        }
        Flow::Flow(__return_storage_ptr__);
      }
      Flow::~Flow((Flow *)&segment);
    }
    Flow::~Flow((Flow *)&size.breakTo.super_IString.str._M_str);
  }
  Flow::~Flow((Flow *)local_68);
  return __return_storage_ptr__;
}

Assistant:

Flow visitMemoryInit(MemoryInit* curr) {
    NOTE_ENTER("MemoryInit");
    Flow dest = self()->visit(curr->dest);
    if (dest.breaking()) {
      return dest;
    }
    Flow offset = self()->visit(curr->offset);
    if (offset.breaking()) {
      return offset;
    }
    Flow size = self()->visit(curr->size);
    if (size.breaking()) {
      return size;
    }
    NOTE_EVAL1(dest);
    NOTE_EVAL1(offset);
    NOTE_EVAL1(size);

    auto* segment = wasm.getDataSegment(curr->segment);

    Address destVal(dest.getSingleValue().getUnsigned());
    Address offsetVal(offset.getSingleValue().getUnsigned());
    Address sizeVal(size.getSingleValue().getUnsigned());

    if (offsetVal + sizeVal > 0 && droppedDataSegments.count(curr->segment)) {
      trap("out of bounds segment access in memory.init");
    }
    if (offsetVal + sizeVal > segment->data.size()) {
      trap("out of bounds segment access in memory.init");
    }
    auto info = getMemoryInstanceInfo(curr->memory);
    auto memorySize = info.instance->getMemorySize(info.name);
    if (destVal + sizeVal > memorySize * Memory::kPageSize) {
      trap("out of bounds memory access in memory.init");
    }
    for (size_t i = 0; i < sizeVal; ++i) {
      Literal addr(destVal + i);
      info.interface()->store8(
        info.instance->getFinalAddressWithoutOffset(addr, 1, memorySize),
        segment->data[offsetVal + i],
        info.name);
    }
    return {};
  }